

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcDistributionElement::IfcDistributionElement
          (IfcDistributionElement *this)

{
  *(undefined ***)&(this->super_IfcElement).field_0x148 = &PTR__Object_0073a1d0;
  *(undefined8 *)&this->field_0x150 = 0;
  *(char **)&this->field_0x158 = "IfcDistributionElement";
  IfcElement::IfcElement(&this->super_IfcElement,&PTR_construction_vtable_24__00743cb0);
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject = 0x743ba8;
  *(undefined8 *)&(this->super_IfcElement).field_0x148 = 0x743c98;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0x88 = 0x743bd0;
  (this->super_IfcElement).super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x743bf8;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0xd0 = 0x743c20;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.field_0x100 = 0x743c48;
  *(undefined8 *)&(this->super_IfcElement).field_0x138 = 0x743c70;
  return;
}

Assistant:

IfcDistributionElement() : Object("IfcDistributionElement") {}